

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  Column *pCVar1;
  size_t sVar2;
  pointer pbVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  
  pCVar1 = this->m_column;
  if ((ulong)((long)(pCVar1->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar1->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= this->m_stringIndex) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/Catch2/single_include/catch2/catch.hpp"
                  ,0x2150,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar8 = pCVar1->m_width;
  sVar7 = indent(this);
  sVar2 = this->m_pos;
  this->m_end = sVar2;
  pbVar3 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pbVar3[this->m_stringIndex]._M_dataplus;
  sVar9 = sVar2;
  if (*(char *)(lVar4 + sVar2) == '\n') {
    sVar9 = sVar2 + 1;
    this->m_end = sVar9;
  }
  sVar8 = sVar8 - sVar7;
  uVar5 = *(size_type *)((long)(pbVar3 + this->m_stringIndex) + 8);
  while ((sVar9 < uVar5 && (*(char *)(lVar4 + sVar9) != '\n'))) {
    sVar9 = sVar9 + 1;
    this->m_end = sVar9;
  }
  sVar7 = sVar8;
  if (sVar9 < sVar2 + sVar8) {
    sVar9 = sVar9 - sVar2;
  }
  else {
    do {
      sVar2 = sVar7;
      if (sVar7 == 0) break;
      bVar6 = isBoundary(this,this->m_pos + sVar7);
      sVar7 = sVar7 - 1;
    } while (!bVar6);
    do {
      sVar9 = sVar2;
      if (sVar9 == 0) {
        this->m_suffix = true;
        sVar9 = sVar8 - 1;
        break;
      }
      bVar6 = isWhitespace(*(char *)((sVar9 - 1) +
                                    *(long *)&(this->m_column->m_strings).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->m_stringIndex]._M_dataplus + this->m_pos));
      sVar2 = sVar9 - 1;
    } while (bVar6);
  }
  this->m_len = sVar9;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}